

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTransform>::moveAppend
          (QGenericArrayOps<QTransform> *this,QTransform *b,QTransform *e)

{
  QTransform *pQVar1;
  void *in_RDX;
  void *in_RSI;
  long in_RDI;
  QTransform *data;
  void *local_10;
  
  if (in_RSI != in_RDX) {
    pQVar1 = QArrayDataPointer<QTransform>::begin((QArrayDataPointer<QTransform> *)0x7023c7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      memcpy(pQVar1 + *(long *)(in_RDI + 0x10),local_10,0x50);
      local_10 = (void *)((long)local_10 + 0x50);
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }